

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDimple * __thiscall ON_SubD::SubDimple(ON_SubD *this,bool bCreateIfNeeded)

{
  ON_SubDimple *this_00;
  shared_ptr<ON_SubDimple> local_40 [2];
  element_type *local_20;
  ON_SubDimple *subdimple;
  ON_SubD *pOStack_10;
  bool bCreateIfNeeded_local;
  ON_SubD *this_local;
  
  subdimple._7_1_ = bCreateIfNeeded;
  pOStack_10 = this;
  local_20 = std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(this->m_subdimple_sp).
                         super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>);
  if ((local_20 == (element_type *)0x0) && ((subdimple._7_1_ & 1) != 0)) {
    this_00 = (ON_SubDimple *)operator_new(0x810);
    ON_SubDimple::ON_SubDimple(this_00);
    local_20 = this_00;
    std::shared_ptr<ON_SubDimple>::shared_ptr<ON_SubDimple,void>(local_40,this_00);
    std::shared_ptr<ON_SubDimple>::operator=(&this->m_subdimple_sp,local_40);
    std::shared_ptr<ON_SubDimple>::~shared_ptr(local_40);
  }
  return local_20;
}

Assistant:

ON_SubDimple* ON_SubD::SubDimple(bool bCreateIfNeeded)
{
  ON_SubDimple* subdimple = m_subdimple_sp.get();
  if (nullptr == subdimple && bCreateIfNeeded)
  {
    subdimple = new ON_SubDimple();
    m_subdimple_sp = std::shared_ptr<ON_SubDimple>(subdimple);
  }
  return subdimple;
}